

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion
          (CollationDataBuilder *this,int64_t *ces,int32_t length,UErrorCode *errorCode)

{
  long *plVar1;
  int iVar2;
  int64_t *piVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  int64_t *piVar7;
  int64_t iVar8;
  ulong uVar9;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar2 = (this->ce64s).count;
  piVar3 = (this->ce64s).elements;
  piVar7 = piVar3;
  for (uVar4 = 0; (long)uVar4 <= (long)iVar2 - (long)length; uVar4 = uVar4 + 1) {
    if ((long)uVar4 < (long)iVar2) {
      iVar8 = piVar3[uVar4];
    }
    else {
      iVar8 = 0;
    }
    if (*ces == iVar8) {
      uVar9 = 1;
      if (0x7ffff < uVar4) goto LAB_0023247d;
      do {
        if ((uint)length == uVar9) {
          uVar5 = length << 8 | (int)uVar4 << 0xd;
          goto LAB_0023245d;
        }
        if ((int)uVar4 + (int)uVar9 < iVar2) {
          iVar8 = piVar7[uVar9];
        }
        else {
          iVar8 = 0;
        }
        plVar1 = ces + uVar9;
        uVar9 = uVar9 + 1;
      } while (iVar8 == *plVar1);
    }
    piVar7 = piVar7 + 1;
  }
  if (iVar2 < 0x80000) {
    uVar4 = 0;
    uVar9 = 0;
    if (0 < length) {
      uVar9 = (ulong)(uint)length;
    }
    for (; uVar9 != uVar4; uVar4 = uVar4 + 1) {
      UVector64::addElement(&this->ce64s,ces[uVar4],errorCode);
    }
    uVar5 = length << 8 | iVar2 << 0xd;
LAB_0023245d:
    uVar6 = uVar5 | 0xc6;
  }
  else {
LAB_0023247d:
    *errorCode = U_BUFFER_OVERFLOW_ERROR;
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion(const int64_t ces[], int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CEs has already been stored.
    int64_t first = ces[0];
    int32_t ce64sMax = ce64s.size() - length;
    for(int32_t i = 0; i <= ce64sMax; ++i) {
        if(first == ce64s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION_TAG, i, length);
                }
                if(ce64s.elementAti(i + j) != ces[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce64s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce64s.addElement(ces[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION_TAG, i, length);
}